

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidArgsortWrongAxis(void)

{
  RepeatedField<long> *pRVar1;
  uint uVar2;
  Rep *pRVar3;
  ulong uVar4;
  bool bVar5;
  FeatureType *pFVar6;
  long *plVar7;
  FeatureDescription *pFVar8;
  ArrayFeatureType *pAVar9;
  NeuralNetworkLayer *pNVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  Tensor *obj;
  void *pvVar12;
  LayerUnion LVar13;
  ostream *poVar14;
  string *psVar15;
  long lVar16;
  undefined8 *puVar17;
  int iVar18;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar19;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this;
  Arena *pAVar20;
  uint uVar21;
  Model m;
  Result res;
  Model MStack_a8;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  CoreML::Specification::Model::Model(&MStack_a8,(Arena *)0x0,false);
  if (MStack_a8.description_ == (ModelDescription *)0x0) {
    pAVar20 = (Arena *)(MStack_a8.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_a8.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    MStack_a8.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar20);
  }
  pRVar3 = ((MStack_a8.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0019a3d5:
    pRVar19 = &(MStack_a8.description_)->input_;
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar19->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar19->super_RepeatedPtrFieldBase,pFVar8);
  }
  else {
    iVar18 = ((MStack_a8.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar18) goto LAB_0019a3d5;
    ((MStack_a8.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar18 + 1;
    pvVar12 = pRVar3->elements[iVar18];
  }
  puVar17 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),"input",puVar17);
  pFVar6 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar6 == (FeatureType *)0x0) {
    pAVar20 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar20);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    uVar4 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar20);
    (pFVar6->Type_).multiarraytype_ = pAVar9;
  }
  pRVar1 = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  if (uVar2 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 1);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar2] = 3;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar2] = 3;
  }
  uVar21 = uVar2 + 1;
  (pAVar9->shape_).current_size_ = uVar21;
  if (uVar21 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 2);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar21] = 5;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar21] = 5;
  }
  uVar21 = uVar2 + 2;
  (pAVar9->shape_).current_size_ = uVar21;
  if (uVar21 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 3);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar21] = 2;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar21] = 2;
  }
  pRVar1->current_size_ = uVar2 + 3;
  if (MStack_a8.description_ == (ModelDescription *)0x0) {
    pAVar20 = (Arena *)(MStack_a8.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_a8.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    MStack_a8.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar20);
  }
  pRVar3 = ((MStack_a8.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0019a592:
    pRVar19 = &(MStack_a8.description_)->output_;
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar19->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar19->super_RepeatedPtrFieldBase,pFVar8);
  }
  else {
    iVar18 = ((MStack_a8.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar18) goto LAB_0019a592;
    ((MStack_a8.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar18 + 1;
    pvVar12 = pRVar3->elements[iVar18];
  }
  puVar17 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),"output",puVar17);
  pFVar6 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar6 == (FeatureType *)0x0) {
    pAVar20 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar20);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    uVar4 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar20);
    (pFVar6->Type_).multiarraytype_ = pAVar9;
  }
  pRVar1 = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  if (uVar2 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 1);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar2] = 3;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar2] = 3;
  }
  uVar21 = uVar2 + 1;
  (pAVar9->shape_).current_size_ = uVar21;
  if (uVar21 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 2);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar21] = 5;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar21] = 5;
  }
  uVar21 = uVar2 + 2;
  (pAVar9->shape_).current_size_ = uVar21;
  if (uVar21 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 3);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar21] = 2;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar21] = 2;
  }
  pRVar1->current_size_ = uVar2 + 3;
  if (MStack_a8._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_a8);
    MStack_a8._oneof_case_[0] = 500;
    pAVar20 = (Arena *)(MStack_a8.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_a8.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    MStack_a8.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar20);
  }
  (MStack_a8.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pRVar3 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_a8.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0019a76d:
    this = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
           &(MStack_a8.Type_.pipeline_)->models_;
    pNVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this->super_RepeatedPtrFieldBase).arena_);
    pNVar10 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this,pNVar10);
  }
  else {
    iVar18 = (MStack_a8.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar3->allocated_size <= iVar18) goto LAB_0019a76d;
    (MStack_a8.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar18 + 1;
    pNVar10 = (NeuralNetworkLayer *)pRVar3->elements[iVar18];
  }
  uVar4 = (pNVar10->super_MessageLite)._internal_metadata_.ptr_;
  puVar17 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar10->name_,"argsort",puVar17);
  pRVar3 = (pNVar10->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0019a7c8:
    pbVar11 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar10->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar10->input_).super_RepeatedPtrFieldBase,pbVar11);
  }
  else {
    iVar18 = (pNVar10->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar18) goto LAB_0019a7c8;
    (pNVar10->input_).super_RepeatedPtrFieldBase.current_size_ = iVar18 + 1;
    pvVar12 = pRVar3->elements[iVar18];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x3a8ef3);
  pRVar3 = (pNVar10->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0019a818:
    pbVar11 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar10->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar10->output_).super_RepeatedPtrFieldBase,pbVar11);
  }
  else {
    iVar18 = (pNVar10->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar18) goto LAB_0019a818;
    (pNVar10->output_).super_RepeatedPtrFieldBase.current_size_ = iVar18 + 1;
    pvVar12 = pRVar3->elements[iVar18];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x3bbdaf);
  pRVar3 = (pNVar10->inputtensor_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0019a868:
    obj = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Tensor>
                    ((pNVar10->inputtensor_).super_RepeatedPtrFieldBase.arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar10->inputtensor_).super_RepeatedPtrFieldBase,obj);
  }
  else {
    iVar18 = (pNVar10->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar18) goto LAB_0019a868;
    (pNVar10->inputtensor_).super_RepeatedPtrFieldBase.current_size_ = iVar18 + 1;
    pvVar12 = pRVar3->elements[iVar18];
  }
  *(undefined4 *)((long)pvVar12 + 0x24) = 3;
  if (pNVar10->_oneof_case_[0] == 0x5b5) {
    LVar13 = pNVar10->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar10);
    pNVar10->_oneof_case_[0] = 0x5b5;
    uVar4 = (pNVar10->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    LVar13.argsort_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArgSortLayerParams>
                   (pAVar20);
    (pNVar10->layer_).argsort_ = (ArgSortLayerParams *)LVar13;
  }
  (LVar13.activation_)->NonlinearityType_ = (NonlinearityTypeUnion)0xffffffffffffffff;
  CoreML::validate<(MLModelType)500>((Result *)local_78,&MStack_a8);
  bVar5 = CoreML::Result::good((Result *)local_78);
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1757);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
  }
  else {
    psVar15 = CoreML::Result::message_abi_cxx11_((Result *)local_78);
    lVar16 = std::__cxx11::string::find((char *)psVar15,0x397d10,0);
    if (lVar16 == -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                 ,0x68);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1758);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,"res.message().find(\"axis\") != std::string::npos",0x2f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    }
    else {
      (LVar13.activation_)->NonlinearityType_ = (NonlinearityTypeUnion)0x3;
      CoreML::validate<(MLModelType)500>((Result *)local_50,&MStack_a8);
      local_78 = local_50;
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_p != &local_38) {
        operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
      }
      bVar5 = CoreML::Result::good((Result *)local_78);
      if (bVar5) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x68);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x175d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"!((res).good())",0xf);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      }
      else {
        psVar15 = CoreML::Result::message_abi_cxx11_((Result *)local_78);
        iVar18 = 0;
        lVar16 = std::__cxx11::string::find((char *)psVar15,0x397d10,0);
        if (lVar16 != -1) goto LAB_0019ac1e;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x68);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x175e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,"res.message().find(\"axis\") != std::string::npos",0x2f);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      }
    }
  }
  std::ostream::put((char)poVar14);
  iVar18 = 1;
  std::ostream::flush();
LAB_0019ac1e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_a8);
  return iVar18;
}

Assistant:

int testInvalidArgsortWrongAxis() {

    // axis can't be negative or larger than equal to input rank

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->set_name("argsort");
    layers->add_input("input");
    layers->add_output("output");
    layers->add_inputtensor()->set_rank(3);

    auto *params = layers->mutable_argsort();

    // CASE 1: negative axis
    params->set_axis(-1);

    // axis should be in range [0, rank)
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("axis") != std::string::npos);

    // CASE 2: axis greater than equal to input rank
    params->set_axis(3);
    res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("axis") != std::string::npos);

    return 0;
}